

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::setContent
          (QWidgetTextControlPrivate *this,TextFormat format,QString *text,QTextDocument *document)

{
  QTextCursor *pQVar1;
  long lVar2;
  QObject *pQVar3;
  QTextDocument *pQVar4;
  QPalettePrivate *pQVar5;
  void **ppvVar6;
  QTextDocument *pQVar7;
  undefined4 *puVar8;
  long in_FS_OFFSET;
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  Connection local_80;
  Connection local_78;
  Connection local_70;
  code *local_68;
  ImplFn local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QTextCursor formatCursor;
  ColorGroup local_40;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)&this->field_0x8;
  pQVar1 = &this->cursor;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  pQVar4 = this->doc;
  if (pQVar4 == (QTextDocument *)0x0) {
    pQVar7 = document;
    if (document == (QTextDocument *)0x0) {
      QApplication::palette((QApplication *)&formatCursor,"QWidgetTextControl");
      (this->palette).currentGroup = local_40;
      pQVar5 = (this->palette).d;
      (this->palette).d = (QPalettePrivate *)_formatCursor;
      _formatCursor = (code *)pQVar5;
      QPalette::~QPalette((QPalette *)&formatCursor);
      pQVar7 = (QTextDocument *)operator_new(0x10);
      QTextDocument::QTextDocument(pQVar7,pQVar3);
    }
    this->doc = pQVar7;
    _q_documentLayoutChanged(this);
    QTextCursor::QTextCursor(&formatCursor,this->doc);
    pQVar5 = *(QPalettePrivate **)&this->cursor;
    *(code **)&this->cursor = _formatCursor;
    _formatCursor = (code *)pQVar5;
    QTextCursor::~QTextCursor(&formatCursor);
    pQVar7 = this->doc;
    _formatCursor = QTextDocument::contentsChanged;
    local_68 = _q_updateCurrentCharFormatAndSelection;
    local_60 = (ImplFn)0x0;
    ppvVar6 = *(void ***)&this->field_0x8;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = _q_updateCurrentCharFormatAndSelection;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_70,(void **)pQVar7,(QObject *)&formatCursor,ppvVar6,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_70);
    pQVar7 = this->doc;
    _formatCursor = QTextDocument::cursorPositionChanged;
    local_68 = _q_emitCursorPosChanged;
    local_60 = (ImplFn)0x0;
    ppvVar6 = *(void ***)&this->field_0x8;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(const_QTextCursor_&),_QtPrivate::List<const_QTextCursor_&>,_void>
         ::impl;
    *(code **)(puVar8 + 4) = _q_emitCursorPosChanged;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_78,(void **)pQVar7,(QObject *)&formatCursor,ppvVar6,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_78);
    pQVar7 = this->doc;
    _formatCursor = QTextDocument::documentLayoutChanged;
    local_68 = _q_documentLayoutChanged;
    local_60 = (ImplFn)0x0;
    ppvVar6 = *(void ***)&this->field_0x8;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar8 + 4) = _q_documentLayoutChanged;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_80,(void **)pQVar7,(QObject *)&formatCursor,ppvVar6,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_80);
    pQVar7 = this->doc;
    local_68 = QWidgetTextControl::undoAvailable;
    local_60 = (ImplFn)0x0;
    _formatCursor = QTextDocument::undoAvailable;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetTextControl::*)(bool),_QtPrivate::List<bool>,_void>
         ::impl;
    *(code **)(puVar8 + 4) = QWidgetTextControl::undoAvailable;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_88,(void **)pQVar7,(QObject *)&formatCursor,(void **)pQVar3,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_88);
    pQVar7 = this->doc;
    local_68 = QWidgetTextControl::redoAvailable;
    local_60 = (ImplFn)0x0;
    _formatCursor = QTextDocument::redoAvailable;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetTextControl::*)(bool),_QtPrivate::List<bool>,_void>
         ::impl;
    *(code **)(puVar8 + 4) = QWidgetTextControl::redoAvailable;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_90,(void **)pQVar7,(QObject *)&formatCursor,(void **)pQVar3,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_90);
    pQVar7 = this->doc;
    local_68 = QWidgetTextControl::modificationChanged;
    local_60 = (ImplFn)0x0;
    _formatCursor = QTextDocument::modificationChanged;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetTextControl::*)(bool),_QtPrivate::List<bool>,_void>
         ::impl;
    *(code **)(puVar8 + 4) = QWidgetTextControl::modificationChanged;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_98,(void **)pQVar7,(QObject *)&formatCursor,(void **)pQVar3,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_98);
    pQVar7 = this->doc;
    local_68 = QWidgetTextControl::blockCountChanged;
    local_60 = (ImplFn)0x0;
    _formatCursor = QTextDocument::blockCountChanged;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetTextControl::*)(int),_QtPrivate::List<int>,_void>::
         impl;
    *(code **)(puVar8 + 4) = QWidgetTextControl::blockCountChanged;
    *(undefined8 *)(puVar8 + 6) = 0;
    QObject::connectImpl
              (local_a0,(void **)pQVar7,(QObject *)&formatCursor,(void **)pQVar3,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_a0);
  }
  QTextDocument::isUndoRedoEnabled();
  if (document == (QTextDocument *)0x0) {
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
  }
  if (setContent(Qt::TextFormat,QString_const&,QTextDocument*)::contentsChangedIndex == '\0') {
    setContent();
  }
  if (setContent(Qt::TextFormat,QString_const&,QTextDocument*)::textChangedIndex == '\0') {
    setContent();
  }
  QMetaObject::disconnect
            ((QObject *)this->doc,setContent::contentsChangedIndex,pQVar3,
             setContent::textChangedIndex);
  if ((text->d).size == 0) {
    if (pQVar4 != (QTextDocument *)0x0) {
      (**(code **)(*(long *)this->doc + 0x60))();
    }
    goto LAB_004be000;
  }
  QTextCursor::QTextCursor(&formatCursor);
  pQVar5 = *(QPalettePrivate **)pQVar1;
  *(code **)pQVar1 = _formatCursor;
  _formatCursor = (code *)pQVar5;
  QTextCursor::~QTextCursor(&formatCursor);
  if (format == MarkdownText) {
    QTextDocument::setMarkdown(this->doc,text,0x104f0c);
LAB_004bdfc5:
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
  }
  else {
    if (format != PlainText) {
      QTextDocument::setHtml((QString *)this->doc);
      goto LAB_004bdfc5;
    }
    _formatCursor = (code *)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&formatCursor,this->doc);
    QTextCursor::beginEditBlock();
    QTextDocument::setPlainText((QString *)this->doc);
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    QTextCursor::select((SelectionType)&formatCursor);
    QTextCursor::setCharFormat((QTextCharFormat *)&formatCursor);
    QTextCursor::endEditBlock();
    QTextCursor::~QTextCursor(&formatCursor);
  }
  QTextCursor::QTextCursor(&formatCursor,this->doc);
  pQVar5 = *(QPalettePrivate **)&this->cursor;
  *(code **)&this->cursor = _formatCursor;
  _formatCursor = (code *)pQVar5;
  QTextCursor::~QTextCursor(&formatCursor);
LAB_004be000:
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QMetaObject::connect
            (local_a8,(int)this->doc,(QObject *)(ulong)(uint)setContent::contentsChangedIndex,
             (int)pQVar3,setContent::textChangedIndex,(int *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QMetaObject::activate(pQVar3,&QWidgetTextControl::staticMetaObject,0,(void **)0x0);
  if (document == (QTextDocument *)0x0) {
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    updateCurrentCharFormat(this);
    selectionChanged(this,false);
    QTextDocument::setModified(SUB81(this->doc,0));
  }
  else {
    updateCurrentCharFormat(this);
    selectionChanged(this,false);
  }
  (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3);
  QMetaObject::activate(pQVar3,&QWidgetTextControl::staticMetaObject,6,(void **)0x0);
  pQVar4 = this->doc;
  _formatCursor = QTextDocument::contentsChange;
  local_68 = _q_contentsChanged;
  local_60 = (ImplFn)0x0;
  ppvVar6 = *(void ***)&this->field_0x8;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(int,_int,_int),_QtPrivate::List<int,_int,_int>,_void>
       ::impl;
  *(code **)(puVar8 + 4) = _q_contentsChanged;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_b0,(void **)pQVar4,(QObject *)&formatCursor,ppvVar6,(QSlotObjectBase *)&local_68,
             (ConnectionType)puVar8,(int *)0x80,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::setContent(Qt::TextFormat format, const QString &text, QTextDocument *document)
{
    Q_Q(QWidgetTextControl);

    // for use when called from setPlainText. we may want to re-use the currently
    // set char format then.
    const QTextCharFormat charFormatForInsertion = cursor.charFormat();

    bool clearDocument = true;
    if (!doc) {
        if (document) {
            doc = document;
        } else {
            palette = QApplication::palette("QWidgetTextControl");
            doc = new QTextDocument(q);
        }
        clearDocument = false;
        _q_documentLayoutChanged();
        cursor = QTextCursor(doc);

// ####        doc->documentLayout()->setPaintDevice(viewport);

        QObjectPrivate::connect(doc, &QTextDocument::contentsChanged, this,
                                &QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection);
        QObjectPrivate::connect(doc, &QTextDocument::cursorPositionChanged, this,
                                &QWidgetTextControlPrivate::_q_emitCursorPosChanged);
        QObjectPrivate::connect(doc, &QTextDocument::documentLayoutChanged, this,
                                &QWidgetTextControlPrivate::_q_documentLayoutChanged);

        // convenience signal forwards
        QObject::connect(doc, &QTextDocument::undoAvailable, q, &QWidgetTextControl::undoAvailable);
        QObject::connect(doc, &QTextDocument::redoAvailable, q, &QWidgetTextControl::redoAvailable);
        QObject::connect(doc, &QTextDocument::modificationChanged, q,
                         &QWidgetTextControl::modificationChanged);
        QObject::connect(doc, &QTextDocument::blockCountChanged, q,
                         &QWidgetTextControl::blockCountChanged);
    }

    bool previousUndoRedoState = doc->isUndoRedoEnabled();
    if (!document)
        doc->setUndoRedoEnabled(false);

    //Saving the index save some time.
    static int contentsChangedIndex = QMetaMethod::fromSignal(&QTextDocument::contentsChanged).methodIndex();
    static int textChangedIndex = QMetaMethod::fromSignal(&QWidgetTextControl::textChanged).methodIndex();
    // avoid multiple textChanged() signals being emitted
    QMetaObject::disconnect(doc, contentsChangedIndex, q, textChangedIndex);

    if (!text.isEmpty()) {
        // clear 'our' cursor for insertion to prevent
        // the emission of the cursorPositionChanged() signal.
        // instead we emit it only once at the end instead of
        // at the end of the document after loading and when
        // positioning the cursor again to the start of the
        // document.
        cursor = QTextCursor();
        if (format == Qt::PlainText) {
            QTextCursor formatCursor(doc);
            // put the setPlainText and the setCharFormat into one edit block,
            // so that the syntax highlight triggers only /once/ for the entire
            // document, not twice.
            formatCursor.beginEditBlock();
            doc->setPlainText(text);
            doc->setUndoRedoEnabled(false);
            formatCursor.select(QTextCursor::Document);
            formatCursor.setCharFormat(charFormatForInsertion);
            formatCursor.endEditBlock();
#if QT_CONFIG(textmarkdownreader)
        } else if (format == Qt::MarkdownText) {
            doc->setMarkdown(text);
            doc->setUndoRedoEnabled(false);
#endif
        } else {
#ifndef QT_NO_TEXTHTMLPARSER
            doc->setHtml(text);
#else
            doc->setPlainText(text);
#endif
            doc->setUndoRedoEnabled(false);
        }
        cursor = QTextCursor(doc);
    } else if (clearDocument) {
        doc->clear();
    }
    cursor.setCharFormat(charFormatForInsertion);

    QMetaObject::connect(doc, contentsChangedIndex, q, textChangedIndex);
    emit q->textChanged();
    if (!document)
        doc->setUndoRedoEnabled(previousUndoRedoState);
    _q_updateCurrentCharFormatAndSelection();
    if (!document)
        doc->setModified(false);

    q->ensureCursorVisible();
    emit q->cursorPositionChanged();

    QObjectPrivate::connect(doc, &QTextDocument::contentsChange, this,
                            &QWidgetTextControlPrivate::_q_contentsChanged, Qt::UniqueConnection);
}